

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O0

Result __thiscall Clasp::ClaspFacade::stopStep(ClaspFacade *this,int signal,bool complete)

{
  bool bVar1;
  undefined1 uVar2;
  Result RVar3;
  SolveData *pSVar4;
  Model *pMVar5;
  byte in_DL;
  Subsystem in_ESI;
  ClaspFacade *in_RDI;
  double tEnd;
  double dVar6;
  Result res;
  double t;
  Summary *in_stack_ffffffffffffffa8;
  ClaspFacade *in_stack_ffffffffffffffb0;
  SharedContext *this_00;
  double local_48;
  Result local_22;
  ClaspFacade *this_01;
  
  this_01 = in_RDI;
  bVar1 = solved(in_stack_ffffffffffffffb0);
  if (!bVar1) {
    tEnd = RealTime::getTime();
    pSVar4 = SingleOwnerPtr<Clasp::ClaspFacade::SolveData,_Clasp::DeleteObject>::operator->
                       ((SingleOwnerPtr<Clasp::ClaspFacade::SolveData,_Clasp::DeleteObject> *)
                        0x121fb8);
    pSVar4->solved = true;
    dVar6 = diffTime(tEnd,(in_RDI->step_).totalTime);
    (in_RDI->step_).totalTime = dVar6;
    dVar6 = ProcessTime::getTime();
    dVar6 = diffTime(dVar6,(in_RDI->step_).cpuTime);
    (in_RDI->step_).cpuTime = dVar6;
    dVar6 = (in_RDI->step_).solveTime;
    if ((dVar6 != 0.0) || (NAN(dVar6))) {
      dVar6 = diffTime(tEnd,(in_RDI->step_).solveTime);
      (in_RDI->step_).solveTime = dVar6;
      if ((in_DL & 1) == 0) {
        local_48 = 0.0;
      }
      else {
        local_48 = diffTime(tEnd,(in_RDI->step_).unsatTime);
      }
      (in_RDI->step_).unsatTime = local_48;
    }
    if ((in_DL & 1) == 0) {
      local_22.signal = (uint8)in_ESI;
      local_22.flags = (in_RDI->step_).numEnum != 0;
    }
    else {
      uVar2 = 2;
      if ((in_RDI->step_).numEnum != 0) {
        uVar2 = 1;
      }
      local_22 = (Result)(CONCAT11((uint8)in_ESI,uVar2) | 4);
    }
    if (in_ESI != subsystem_facade) {
      local_22 = (Result)((ushort)local_22 | 8);
    }
    (in_RDI->step_).result = local_22;
    bVar1 = SolveResult::sat((SolveResult *)0x122110);
    if (((bVar1) &&
        (pMVar5 = Summary::model((Summary *)in_stack_ffffffffffffffb0),
        (*(uint *)&pMVar5->field_0x20 >> 0x1a & 1) != 0)) && ((in_RDI->step_).numOptimal == 0)) {
      (in_RDI->step_).numOptimal = 1;
    }
    updateStats(this_01);
    this_00 = &in_RDI->ctx;
    StepReady::StepReady((StepReady *)this_00,in_stack_ffffffffffffffa8);
    SharedContext::report(this_00,(Event *)in_stack_ffffffffffffffa8);
    SharedContext::report((SharedContext *)this_01,in_ESI);
  }
  RVar3 = result(in_RDI);
  return RVar3;
}

Assistant:

ClaspFacade::Result ClaspFacade::stopStep(int signal, bool complete) {
	if (!solved()) {
		double t = RealTime::getTime();
		solve_->solved  = true;
		step_.totalTime = diffTime(t, step_.totalTime);
		step_.cpuTime   = diffTime(ProcessTime::getTime(), step_.cpuTime);
		if (step_.solveTime) {
			step_.solveTime = diffTime(t, step_.solveTime);
			step_.unsatTime = complete ? diffTime(t, step_.unsatTime) : 0;
		}
		Result res = {uint8(0), uint8(signal)};
		if (complete) { res.flags = uint8(step_.numEnum ? Result::SAT : Result::UNSAT) | Result::EXT_EXHAUST; }
		else          { res.flags = uint8(step_.numEnum ? Result::SAT : Result::UNKNOWN); }
		if (signal)   { res.flags|= uint8(Result::EXT_INTERRUPT); }
		step_.result = res;
		if (res.sat() && step_.model()->opt && !step_.numOptimal) {
			step_.numOptimal = 1;
		}
		updateStats();
		ctx.report(StepReady(step_));
		ctx.report(Event::subsystem_facade);
	}
	return result();
}